

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O0

BOOL __thiscall
Js::CrossSiteObject<Js::SpreadArgument>::SetPropertyWithAttributes
          (CrossSiteObject<Js::SpreadArgument> *this,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  Var value_00;
  PropertyOperationFlags flags_local;
  PropertyValueInfo *info_local;
  PropertyAttributes attributes_local;
  Var value_local;
  PropertyId propertyId_local;
  CrossSiteObject<Js::SpreadArgument> *this_local;
  
  scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  value_00 = CrossSite::MarshalVar(scriptContext,value,false);
  BVar1 = SpreadArgument::SetPropertyWithAttributes
                    (&this->super_SpreadArgument,propertyId,value_00,attributes,info,flags,
                     possibleSideEffects);
  return BVar1;
}

Assistant:

BOOL CrossSiteObject<T>::SetPropertyWithAttributes(PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects /* = SideEffects_Any */)
    {
        value = CrossSite::MarshalVar(this->GetScriptContext(), value);
        return __super::SetPropertyWithAttributes(propertyId, value, attributes, info, flags, possibleSideEffects);
    }